

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::calculate
          (FunctionalTest7_8 *this,GLuint *combination,vec4<float> *left,vec4<float> *right,
          vec4<unsigned_int> *indices,vec4<float> *out_combined,vec4<float> *out_combined_inverted,
          vec4<float> *out_constant,vec4<float> *out_constant_inverted,vec4<float> *out_dynamic,
          vec4<float> *out_dynamic_inverted,vec4<float> *out_loop)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  GLuint local_88 [8];
  float local_68 [14];
  GLuint dynamic_combination [4];
  
  local_88[0] = combination[indices->m_x];
  local_88[1] = combination[indices->m_y];
  local_88[2] = combination[indices->m_z];
  local_88[3] = combination[indices->m_w];
  local_68[0] = -5.0;
  local_68[1] = -6.0;
  local_68[2] = -7.0;
  local_68[3] = -8.0;
  local_68[4] = -1.0;
  local_68[5] = -2.0;
  local_68[6] = -3.0;
  local_68[7] = -4.0;
  local_68[8] = 5.0;
  local_68[9] = 6.0;
  local_68[10] = 7.0;
  local_68[0xb] = 8.0;
  local_68[0xc] = 1.0;
  local_68[0xd] = 2.0;
  dynamic_combination[0] = 0x40400000;
  dynamic_combination[1] = 0x40800000;
  fVar7 = left->m_x;
  fVar8 = left->m_y;
  fVar9 = left->m_z;
  fVar10 = left->m_w;
  fVar1 = right->m_x;
  fVar2 = right->m_y;
  fVar3 = right->m_z;
  fVar4 = right->m_w;
  lVar5 = 0xc;
  lVar6 = 0;
  local_a8 = 1.0;
  local_ac = 1.0;
  local_a4 = 2.0;
  local_b0 = 2.0;
  local_a0 = 3.0;
  local_b4 = 3.0;
  local_9c = 4.0;
  local_b8 = 4.0;
  fVar11 = fVar7;
  fVar12 = fVar8;
  fVar13 = fVar9;
  fVar14 = fVar7;
  fVar15 = fVar8;
  fVar16 = fVar9;
  fVar17 = fVar10;
  fVar18 = fVar10;
  local_c8 = fVar10;
  local_c4 = fVar9;
  local_c0 = fVar8;
  local_bc = fVar7;
  do {
    if (*(int *)((long)combination + lVar6) == 0) {
      fVar11 = fVar11 + fVar1;
      fVar12 = fVar12 + fVar2;
      fVar13 = fVar13 + fVar3;
      fVar18 = fVar18 + fVar4;
    }
    else {
      fVar11 = fVar11 * fVar1;
      fVar12 = fVar12 * fVar2;
      fVar13 = fVar13 * fVar3;
      fVar18 = fVar18 * fVar4;
    }
    if (*(int *)((long)combination + lVar5) == 0) {
      local_bc = local_bc + fVar1;
      local_c0 = local_c0 + fVar2;
      local_c4 = local_c4 + fVar3;
      local_c8 = local_c8 + fVar4;
    }
    else {
      local_bc = local_bc * fVar1;
      local_c0 = local_c0 * fVar2;
      local_c4 = local_c4 * fVar3;
      local_c8 = local_c8 * fVar4;
    }
    if (*(int *)((long)combination + lVar6) == 0) {
      local_ac = local_ac + local_68[lVar6];
      local_b0 = local_b0 + local_68[lVar6 + 1];
      local_b4 = local_b4 + local_68[lVar6 + 2];
      local_b8 = local_b8 + local_68[lVar6 + 3];
    }
    else {
      local_ac = local_ac * local_68[lVar6];
      local_b0 = local_b0 * local_68[lVar6 + 1];
      local_b4 = local_b4 * local_68[lVar6 + 2];
      local_b8 = local_b8 * local_68[lVar6 + 3];
    }
    if (*(int *)((long)combination + lVar5) == 0) {
      local_a8 = local_a8 + local_68[lVar6];
      local_a4 = local_a4 + local_68[lVar6 + 1];
      local_a0 = local_a0 + local_68[lVar6 + 2];
      local_9c = local_9c + local_68[lVar6 + 3];
    }
    else {
      local_a8 = local_a8 * local_68[lVar6];
      local_a4 = local_a4 * local_68[lVar6 + 1];
      local_a0 = local_a0 * local_68[lVar6 + 2];
      local_9c = local_9c * local_68[lVar6 + 3];
    }
    if (*(int *)((long)local_88 + lVar6) == 0) {
      fVar14 = fVar14 + fVar1;
      fVar15 = fVar15 + fVar2;
      fVar16 = fVar16 + fVar3;
      fVar17 = fVar17 + fVar4;
    }
    else {
      fVar14 = fVar14 * fVar1;
      fVar15 = fVar15 * fVar2;
      fVar16 = fVar16 * fVar3;
      fVar17 = fVar17 * fVar4;
    }
    if (*(int *)((long)local_88 + lVar5) == 0) {
      fVar7 = fVar7 + fVar1;
      fVar8 = fVar8 + fVar2;
      fVar9 = fVar9 + fVar3;
      fVar10 = fVar10 + fVar4;
    }
    else {
      fVar7 = fVar7 * fVar1;
      fVar8 = fVar8 * fVar2;
      fVar9 = fVar9 * fVar3;
      fVar10 = fVar10 * fVar4;
    }
    lVar5 = lVar5 + -4;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  out_combined->m_x = fVar11;
  out_combined->m_y = fVar12;
  out_combined->m_z = fVar13;
  out_combined->m_w = fVar18;
  out_combined_inverted->m_x = local_bc;
  out_combined_inverted->m_y = local_c0;
  out_combined_inverted->m_z = local_c4;
  out_combined_inverted->m_w = local_c8;
  out_constant->m_x = local_ac;
  out_constant->m_y = local_b0;
  out_constant->m_z = local_b4;
  out_constant->m_w = local_b8;
  out_constant_inverted->m_x = local_a8;
  out_constant_inverted->m_y = local_a4;
  out_constant_inverted->m_z = local_a0;
  out_constant_inverted->m_w = local_9c;
  out_dynamic->m_x = fVar14;
  out_dynamic->m_y = fVar15;
  out_dynamic->m_z = fVar16;
  out_dynamic->m_w = fVar17;
  out_dynamic_inverted->m_x = fVar7;
  out_dynamic_inverted->m_y = fVar8;
  out_dynamic_inverted->m_z = fVar9;
  out_dynamic_inverted->m_w = fVar10;
  out_loop->m_x = fVar11;
  out_loop->m_y = fVar12;
  out_loop->m_z = fVar13;
  out_loop->m_w = fVar18;
  return;
}

Assistant:

void FunctionalTest7_8::calculate(
	const glw::GLuint combination[4], const Utils::vec4<glw::GLfloat>& left, const Utils::vec4<glw::GLfloat>& right,
	const Utils::vec4<glw::GLuint>& indices, Utils::vec4<glw::GLfloat>& out_combined,
	Utils::vec4<glw::GLfloat>& out_combined_inverted, Utils::vec4<glw::GLfloat>& out_constant,
	Utils::vec4<glw::GLfloat>& out_constant_inverted, Utils::vec4<glw::GLfloat>& out_dynamic,
	Utils::vec4<glw::GLfloat>& out_dynamic_inverted, Utils::vec4<glw::GLfloat>& out_loop) const
{
	/* Indices used by "dynamic" operations, range <0..4> */
	const GLuint dynamic_combination[4] = { combination[indices.m_x], combination[indices.m_y],
											combination[indices.m_z], combination[indices.m_w] };

	/* Values used by "constant" operations, come from shader code */
	const Utils::vec4<glw::GLfloat> constant_values[] = { Utils::vec4<glw::GLfloat>(1, 2, 3, 4),
														  Utils::vec4<glw::GLfloat>(-5, -6, -7, -8),
														  Utils::vec4<glw::GLfloat>(-1, -2, -3, -4),
														  Utils::vec4<glw::GLfloat>(5, 6, 7, 8),
														  Utils::vec4<glw::GLfloat>(1, 2, 3, 4) };

	/* Start values */
	Utils::vec4<glw::GLfloat> combined			= left;
	Utils::vec4<glw::GLfloat> combined_inverted = left;
	Utils::vec4<glw::GLfloat> constant			= constant_values[0];
	Utils::vec4<glw::GLfloat> constant_inverted = constant_values[0];
	Utils::vec4<glw::GLfloat> dynamic			= left;
	Utils::vec4<glw::GLfloat> dynamic_inverted  = left;

	/* Calculate expected results */
	for (GLuint i = 0; i < 4; ++i)
	{
		GLuint function					 = combination[i];
		GLuint function_inverted		 = combination[3 - i];
		GLuint dynamic_function			 = dynamic_combination[i];
		GLuint dynamic_function_inverted = dynamic_combination[3 - i];

		calculate(function, combined, right, combined);
		calculate(function_inverted, combined_inverted, right, combined_inverted);
		calculate(function, constant, constant_values[i + 1], constant);
		calculate(function_inverted, constant_inverted, constant_values[i + 1], constant_inverted);
		calculate(dynamic_function, dynamic, right, dynamic);
		calculate(dynamic_function_inverted, dynamic_inverted, right, dynamic_inverted);
	}

	/* Store results */
	out_combined		  = combined;
	out_combined_inverted = combined_inverted;
	out_constant		  = constant;
	out_constant_inverted = constant_inverted;
	out_dynamic			  = dynamic;
	out_dynamic_inverted  = dynamic_inverted;
	out_loop			  = combined;
}